

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

void __thiscall
imrt::Station::reduce_apertures
          (Station *this,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  int iVar3;
  _Rb_tree_color _Var4;
  _Rb_tree_color _Var5;
  int iVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_color _Var8;
  int iVar9;
  _Rb_tree_color unaff_EBP;
  int iVar10;
  long lVar11;
  _Rb_tree_color unaff_R13D;
  long lVar12;
  double local_40;
  
  if ((this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var7 = (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->int2nb)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
      local_40 = 0.0;
    }
    else {
      iVar6 = 10000;
      iVar9 = 0;
      _Var8 = _S_red;
      do {
        _Var2 = p_Var7[1]._M_color;
        iVar3 = *(int *)&p_Var7[1].field_0x4;
        iVar10 = iVar9;
        if (iVar3 <= iVar9) {
          iVar10 = iVar3;
        }
        if (_Var8 == _S_red) {
          iVar10 = iVar3;
        }
        iVar10 = (_Var2 - _Var8) * iVar10;
        _Var4 = _Var8;
        _Var5 = _Var2;
        if (_Var8 == _S_red || iVar3 <= iVar9) {
          _Var4 = _Var2;
          _Var5 = _Var8;
        }
        if (iVar10 < iVar6) {
          unaff_EBP = _Var4;
          iVar6 = iVar10;
          unaff_R13D = _Var5;
        }
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        iVar9 = iVar3;
        _Var8 = _Var2;
      } while ((_Rb_tree_header *)p_Var7 != p_Var1);
      local_40 = (double)(int)unaff_R13D;
    }
    iVar6 = Collimator::getXdim(this->collimator);
    if (0 < iVar6) {
      lVar12 = 0;
      do {
        iVar6 = Collimator::getYdim(this->collimator);
        if (0 < iVar6) {
          lVar11 = 0;
          do {
            if (unaff_EBP == (int)((this->I).p[lVar12][lVar11] + 0.5)) {
              change_intensity(this,(int)lVar12,(int)lVar11,local_40,diff);
            }
            lVar11 = lVar11 + 1;
            iVar6 = Collimator::getYdim(this->collimator);
          } while (lVar11 < iVar6);
        }
        lVar12 = lVar12 + 1;
        iVar6 = Collimator::getXdim(this->collimator);
      } while (lVar12 < iVar6);
    }
  }
  return;
}

Assistant:

void Station::reduce_apertures(list< pair< int, double > >& diff){
	  if(int2nb.size()==0) return;

      int from,to, min_diff=10000;
      int prev=0; int nprev=0;
      for(auto i:int2nb  ){
          int n= (prev!=0)? min(i.second,nprev) : i.second;
          if((i.first-prev)*n < min_diff){
            min_diff=(i.first-prev)*n;
            if(nprev<i.second && prev!=0) {from=prev; to=i.first;}
            else {to=prev; from=i.first;}
          }
          prev=i.first;
          nprev=i.second;
      }
    //  printIntensity();
      for(int i=0; i<collimator.getXdim(); i++)
        for(int j=0; j<collimator.getYdim(); j++)
          if(int(I(i,j)+0.5)==from)
            change_intensity(i, j, to, &diff);
  }